

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_freqt(HTS_Vocoder *v,double *c1,int m1,double *c2,int m2,double a)

{
  double dVar1;
  double dVar2;
  double *ptr;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double *a_00;
  ulong uVar7;
  
  uVar7 = (ulong)m2;
  ptr = v->freqt_buff;
  uVar3 = v->freqt_size;
  if (v->freqt_size < uVar7) {
    if (ptr != (double *)0x0) {
      HTS_free(ptr);
    }
    ptr = (double *)HTS_calloc((long)(m2 * 2 + 2),8);
    v->freqt_buff = ptr;
    v->freqt_size = uVar7;
    uVar3 = uVar7;
  }
  a_00 = ptr + uVar3 + 1;
  for (lVar4 = 0; lVar4 <= (long)uVar7; lVar4 = lVar4 + 1) {
    a_00[lVar4] = 0.0;
  }
  lVar4 = 2;
  for (iVar5 = -m1; iVar5 < 1; iVar5 = iVar5 + 1) {
    lVar6 = lVar4;
    if (-1 < m2) {
      dVar1 = *a_00;
      dVar2 = c1[(uint)-iVar5];
      *ptr = dVar1;
      *a_00 = a * dVar1 + dVar2;
      if (m2 != 0) {
        dVar1 = ptr[uVar3 + 2];
        ptr[1] = dVar1;
        ptr[uVar3 + 2] = *ptr * (1.0 - a * a) + dVar1 * a;
      }
    }
    for (; lVar6 <= (long)uVar7; lVar6 = lVar6 + 1) {
      dVar1 = ptr[uVar3 + lVar6 + 1];
      ptr[lVar6] = dVar1;
      ptr[uVar3 + lVar6 + 1] = (dVar1 - ptr[uVar3 + lVar6]) * a + ptr[lVar6 + -1];
    }
  }
  HTS_movem(a_00,c2,m2 + 1);
  return;
}

Assistant:

static void HTS_freqt(HTS_Vocoder * v, const double *c1, const int m1, double *c2, const int m2, const double a)
{
   int i, j;
   const double b = 1 - a * a;
   double *g;

   if (m2 > v->freqt_size) {
      if (v->freqt_buff != NULL)
         HTS_free(v->freqt_buff);
      v->freqt_buff = (double *) HTS_calloc(m2 + m2 + 2, sizeof(double));
      v->freqt_size = m2;
   }
   g = v->freqt_buff + v->freqt_size + 1;

   for (i = 0; i < m2 + 1; i++)
      g[i] = 0.0;

   for (i = -m1; i <= 0; i++) {
      if (0 <= m2)
         g[0] = c1[-i] + a * (v->freqt_buff[0] = g[0]);
      if (1 <= m2)
         g[1] = b * v->freqt_buff[0] + a * (v->freqt_buff[1] = g[1]);
      for (j = 2; j <= m2; j++)
         g[j] = v->freqt_buff[j - 1] + a * ((v->freqt_buff[j] = g[j]) - g[j - 1]);
   }

   HTS_movem(g, c2, m2 + 1);
}